

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::SetNativeEntryPoint
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,
          JavascriptMethod originalEntryPoint,JavascriptMethod directEntryPoint)

{
  undefined1 *puVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode EVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  int iVar9;
  uint uVar10;
  
  if (((entryPointInfo->super_EntryPointInfo).field_0x18 & 0x10) != 0) {
    return;
  }
  uVar2 = *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  BVar6 = IsIntermediateCodeGenThunk
                    ((JavascriptMethod)
                     (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod);
  if ((((BVar6 == 0) && (DAT_015c4a8a == '\0')) && ((uVar2 >> 9 & 1) == 0)) &&
     ((*(uint *)&this->field_0x178 & 0x20000000) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf55,
                                "(IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || (Js::Configuration::Global.flags.Prejit) || this->m_isFromNativeCodeModule || isAsmJs)"
                                ,
                                "IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || CONFIG_FLAG(Prejit) || this->m_isFromNativeCodeModule || isAsmJs"
                               );
    if (!bVar4) goto LAB_00771d6e;
    *puVar8 = 0;
  }
  EntryPointInfo::ProcessJitTransferData(&entryPointInfo->super_EntryPointInfo);
  if ((FunctionEntryPointInfo *)
      (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr ==
      entryPointInfo) {
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_00771d6e;
      *puVar8 = 0;
    }
    if ((FunctionBody *)
        (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar4) goto LAB_00771d6e;
      *puVar8 = 0;
    }
    FunctionInfo::SetOriginalEntryPoint
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr,
               originalEntryPoint);
  }
  if (((entryPointInfo->entryPointIndex == 0) && ((*(uint *)&this->field_0x178 & 0x20000100) == 0))
     && (bVar4 = DynamicProfileInfo::IsEnabled(this), bVar4)) {
    directEntryPoint = DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
  }
  (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)directEntryPoint
  ;
  CaptureDynamicProfileState(this,entryPointInfo);
  if (entryPointInfo->jitMode != FullJit) {
    if (entryPointInfo->jitMode == SimpleJit) {
      EVar5 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
      if (EVar5 != SimpleJit) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf6b,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                    "GetExecutionMode() == ExecutionMode::SimpleJit");
        if (!bVar4) goto LAB_00771d6e;
        *puVar8 = 0;
      }
      FunctionProxy::SetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo,entryPointInfo);
      uVar7 = (this->executionState).interpretedCount;
      uVar10 = (uint)(this->executionState).simpleJitLimit;
      iVar9 = uVar10 - uVar7;
      if (uVar10 < uVar7 || iVar9 == 0) {
        iVar9 = 0;
      }
      SetSimpleJitCallCount(this,(uint16)iVar9);
      goto LAB_00771d46;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf71,"(entryPointInfo->GetJitMode() == ExecutionMode::FullJit)",
                                "entryPointInfo->GetJitMode() == ExecutionMode::FullJit");
    if (!bVar4) goto LAB_00771d6e;
    *puVar8 = 0;
  }
  if (((uVar2 >> 9 & 1) == 0) &&
     (EVar5 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState),
     EVar5 != FullJit)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf72,"(isAsmJs || GetExecutionMode() == ExecutionMode::FullJit)",
                                "isAsmJs || GetExecutionMode() == ExecutionMode::FullJit");
    if (!bVar4) {
LAB_00771d6e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  uVar7 = ((_DAT_015c794c + 1U & 0xff) - 1) * (uint)(byte)DAT_015c7954;
  if (0xfe < uVar7) {
    uVar7 = 0xff;
  }
  entryPointInfo->callsCount = uVar7;
LAB_00771d46:
  TraceExecutionMode(this,(char *)0x0);
  VTuneChakraProfile::LogMethodNativeLoadEvent(this,entryPointInfo);
  puVar1 = &(entryPointInfo->super_EntryPointInfo).field_0x18;
  *puVar1 = *puVar1 | 0x10;
  return;
}

Assistant:

void FunctionBody::SetNativeEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod originalEntryPoint, JavascriptMethod directEntryPoint)
    {
        if (entryPointInfo->IsNativeEntryPointProcessed())
        {
            return;
        }
        bool isAsmJs = this->GetIsAsmjsMode();
        Assert(IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || CONFIG_FLAG(Prejit) || this->m_isFromNativeCodeModule || isAsmJs);
        entryPointInfo->EnsureIsReadyToCall();

        // keep originalEntryPoint updated with the latest known good native entry point
        if (entryPointInfo == this->GetDefaultEntryPointInfo())
        {
            this->SetOriginalEntryPoint(originalEntryPoint);
        }

        if (entryPointInfo->entryPointIndex == 0 && this->NeedEnsureDynamicProfileInfo())
        {
            entryPointInfo->jsMethod = DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
        }
        else
        {
            entryPointInfo->jsMethod = directEntryPoint;
        }

        this->CaptureDynamicProfileState(entryPointInfo);

        if(entryPointInfo->GetJitMode() == ExecutionMode::SimpleJit)
        {
            Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
            SetSimpleJitEntryPointInfo(entryPointInfo);
            ResetSimpleJitCallCount();
        }
        else
        {
            Assert(entryPointInfo->GetJitMode() == ExecutionMode::FullJit);
            Assert(isAsmJs || GetExecutionMode() == ExecutionMode::FullJit);
            entryPointInfo->callsCount =
                static_cast<uint8>(
                    min(
                        static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejit))) *
                            (Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() - 1),
                        0xffu));
        }
        TraceExecutionMode();

        JS_ETW(EtwTrace::LogMethodNativeLoadEvent(this, entryPointInfo));
#ifdef VTUNE_PROFILING
        VTuneChakraProfile::LogMethodNativeLoadEvent(this, entryPointInfo);
#endif

#ifdef _M_ARM
        // For ARM we need to make sure that pipeline is synchronized with memory/cache for newly jitted code.
        _InstructionSynchronizationBarrier();
#endif

        entryPointInfo->SetNativeEntryPointProcessed();
    }